

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O3

void poly_BinarySink_write(BinarySink *bs,void *blkv,size_t len)

{
  ulong *puVar1;
  uchar uVar2;
  BinarySink *pBVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  uchar *data;
  uint uVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  ulong local_48;
  ulong uStack_40;
  
  iVar5 = *(int *)&bs[-5].binarysink_;
  bVar11 = len != 0;
  if (bVar11 && iVar5 < 4) {
    uVar6 = 7 - iVar5;
    sVar7 = len;
    iVar4 = iVar5;
    do {
      uVar2 = *blkv;
      blkv = (void *)((long)blkv + 1);
      *(uchar *)((long)bs + ((ulong)uVar6 - 100)) = uVar2;
      iVar5 = iVar4 + 1;
      *(int *)&bs[-5].binarysink_ = iVar5;
      len = sVar7 - 1;
      bVar11 = sVar7 != 1;
      if (2 < iVar4) break;
      uVar6 = uVar6 - 1;
      bVar12 = sVar7 != 1;
      sVar7 = len;
      iVar4 = iVar5;
    } while (bVar12);
  }
  if (iVar5 == 4) {
    bVar10 = 0;
    *(undefined8 *)((long)&bs[-8].write + 4) = 0;
    uVar6 = *(uint *)((long)&bs[-5].binarysink_ + 4);
    uVar9 = *(uint *)&bs[-4].write;
    *(uint *)((long)&bs[-8].writefmtv + 4) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    *(uint *)&bs[-8].binarysink_ =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    *(undefined8 *)((long)&bs[-5].writefmtv + 4) = 0x500000040;
    chacha20_round((chacha20 *)((long)&bs[-10].write + 4));
    local_48 = *(ulong *)((long)&bs[-8].binarysink_ + 4) & 0xffffffc0fffffff;
    uStack_40 = *(ulong *)((long)&bs[-7].write + 4) & 0xffffffc0ffffffc;
    bs[-3].binarysink_ = (BinarySink *)0x0;
    bs[-3].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
    bs[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
    lVar8 = 0;
    do {
      puVar1 = (ulong *)((long)&bs[-3].write + (ulong)((uint)lVar8 & 0xfffffff8));
      *puVar1 = *puVar1 | (ulong)*(byte *)((long)&local_48 + lVar8) << (bVar10 & 0x38);
      lVar8 = lVar8 + 1;
      bVar10 = bVar10 + 8;
    } while (lVar8 != 0x10);
    smemclr(&local_48,0x10);
    pBVar3 = *(BinarySink **)((long)&bs[-7].binarysink_ + 4);
    bs[-4].writefmtv =
         *(_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr **)((long)&bs[-7].writefmtv + 4);
    bs[-4].binarysink_ = pBVar3;
    *(undefined4 *)((long)&bs[-5].writefmtv + 4) = 0x40;
  }
  if (bVar11) {
    iVar5 = *(int *)&bs[-1].binarysink_;
    uVar6 = (uint)len;
    if (iVar5 != 0) {
      if (uVar6 != 0 && iVar5 < 0x10) {
        do {
          uVar2 = *blkv;
          blkv = (void *)((long)blkv + 1);
          *(int *)&bs[-1].binarysink_ = iVar5 + 1;
          *(uchar *)((long)&bs[-1].write + (long)iVar5) = uVar2;
          iVar4 = (int)len;
          uVar6 = iVar4 - 1;
          iVar5 = *(int *)&bs[-1].binarysink_;
          if (0xf < iVar5) break;
          len = (size_t)uVar6;
        } while (iVar4 != 1);
      }
      if (iVar5 == 0x10) {
        poly1305_feed_chunk((poly1305 *)&bs[-4].writefmtv,(uchar *)(bs + -1),0x10);
        *(undefined4 *)&bs[-1].binarysink_ = 0;
      }
    }
    uVar9 = uVar6;
    if (0xf < (int)uVar6) {
      do {
        poly1305_feed_chunk((poly1305 *)&bs[-4].writefmtv,(uchar *)blkv,0x10);
        uVar6 = uVar9 - 0x10;
        blkv = (void *)((long)blkv + 0x10);
        bVar11 = 0x1f < uVar9;
        uVar9 = uVar6;
      } while (bVar11);
    }
    if (uVar6 != 0) {
      memcpy(bs + -1,blkv,(long)(int)uVar6);
      *(uint *)&bs[-1].binarysink_ = uVar6;
    }
  }
  return;
}

Assistant:

static void poly_BinarySink_write(BinarySink *bs, const void *blkv, size_t len)
{
    struct ccp_context *ctx = BinarySink_DOWNCAST(bs, struct ccp_context);
    const unsigned char *blk = (const unsigned char *)blkv;

    /* First 4 bytes are the IV */
    while (ctx->mac_initialised < 4 && len) {
        ctx->mac_iv[7 - ctx->mac_initialised] = *blk++;
        ++ctx->mac_initialised;
        --len;
    }

    /* Initialise the IV if needed */
    if (ctx->mac_initialised == 4) {
        chacha20_iv(&ctx->b_cipher, ctx->mac_iv);
        ++ctx->mac_initialised;  /* Don't do it again */

        /* Do first rotation */
        chacha20_round(&ctx->b_cipher);

        /* Set the poly key */
        poly1305_key(&ctx->mac, make_ptrlen(ctx->b_cipher.current, 32));

        /* Set the first round as used */
        ctx->b_cipher.currentIndex = 64;
    }

    /* Update the MAC with anything left */
    if (len) {
        poly1305_feed(&ctx->mac, blk, len);
    }
}